

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::Utils::texture::create
          (texture *this,GLuint width,GLuint height,GLenum internal_format)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  socklen_t __len;
  sockaddr *__addr;
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  release(this);
  this->m_texture_type = TEX_2D;
  (**(code **)(lVar3 + 0x6f8))(1,this);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  iVar1 = 0x17f0739;
  __len = 0x4826;
  glu::checkError(dVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x4826);
  bind(this,iVar1,__addr,__len);
  (**(code **)(lVar3 + 0x1380))(0xde1,1,internal_format,width,height);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"TexStorage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x482b);
  return;
}

Assistant:

void Utils::texture::create(glw::GLuint width, glw::GLuint height, glw::GLenum internal_format)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	release();

	m_texture_type = TEX_2D;

	gl.genTextures(1, &m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	bind();

	gl.texStorage2D(GL_TEXTURE_2D, 1 /* levels */, internal_format, width, height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
}